

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O1

uint __thiscall Js::ByteCodeWriter::DataChunk::RemainingBytes(DataChunk *this)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  uVar1 = this->byteSize;
  if (this->currentByte < this->buffer) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x2f,"(currentByte >= buffer)","currentByte >= buffer");
    if (!bVar4) goto LAB_008aa08e;
    *puVar5 = 0;
  }
  if (uVar1 < (uint)(*(int *)&this->currentByte - *(int *)&this->buffer)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x2a,"(byteSize >= GetCurrentOffset())",
                                "byteSize >= GetCurrentOffset()");
    if (!bVar4) goto LAB_008aa08e;
    *puVar5 = 0;
  }
  uVar2 = this->byteSize;
  if (this->currentByte < this->buffer) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                ,0x2f,"(currentByte >= buffer)","currentByte >= buffer");
    if (!bVar4) {
LAB_008aa08e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return uVar2 + (*(int *)&this->buffer - *(int *)&this->currentByte);
}

Assistant:

inline uint RemainingBytes()
            {
                Assert(byteSize >= GetCurrentOffset());
                return byteSize - GetCurrentOffset();
            }